

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_io.c
# Opt level: O0

void csp_sendto(uint8_t prio,uint16_t dest,uint8_t dport,uint8_t src_port,uint32_t opts,
               csp_packet_t *packet)

{
  undefined1 in_CL;
  undefined1 in_DL;
  undefined2 in_SI;
  undefined1 in_DIL;
  uint in_R8D;
  long in_R9;
  undefined2 in_stack_00000010;
  undefined1 in_stack_00000016;
  csp_packet_t *in_stack_00000018;
  csp_id_t_conflict *in_stack_00000020;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((in_R8D & 0x8000) == 0) {
    *(undefined1 *)(in_R9 + 0x23) = 0;
  }
  if ((in_R8D & 1) == 0) {
    if ((in_R8D & 4) != 0) {
      *(byte *)(in_R9 + 0x23) = *(byte *)(in_R9 + 0x23) | 8;
    }
    if ((in_R8D & 0x40) != 0) {
      *(byte *)(in_R9 + 0x23) = *(byte *)(in_R9 + 0x23) | 1;
    }
    *(undefined2 *)(in_R9 + 0x26) = in_SI;
    *(undefined1 *)(in_R9 + 0x28) = in_DL;
    *(undefined1 *)(in_R9 + 0x29) = in_CL;
    *(undefined1 *)(in_R9 + 0x22) = in_DIL;
    csp_send_direct(in_stack_00000020,in_stack_00000018,
                    (csp_iface_t *)
                    CONCAT17(prio,CONCAT16(in_stack_00000016,
                                           CONCAT24(dest,CONCAT13(dport,CONCAT12(src_port,
                                                  in_stack_00000010))))));
  }
  else {
    csp_dbg_errno = '\a';
    csp_buffer_free((void *)CONCAT44(in_R8D,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void csp_sendto(uint8_t prio, uint16_t dest, uint8_t dport, uint8_t src_port, uint32_t opts, csp_packet_t * packet) {

	if (!(opts & CSP_O_SAME))
		packet->id.flags = 0;

	if (opts & CSP_O_RDP) {
		csp_dbg_errno = CSP_DBG_ERR_UNSUPPORTED;
		csp_buffer_free(packet);
		return;
	}

	if (opts & CSP_O_HMAC) {
#if (CSP_USE_HMAC)
		packet->id.flags |= CSP_FHMAC;
#else
		csp_dbg_errno = CSP_DBG_ERR_UNSUPPORTED;
		csp_buffer_free(packet);
		return;
#endif
	}

	if (opts & CSP_O_CRC32) {
		packet->id.flags |= CSP_FCRC32;
	}

	packet->id.dst = dest;
	packet->id.dport = dport;
	packet->id.sport = src_port;
	packet->id.pri = prio;

	csp_send_direct(&packet->id, packet, NULL);

}